

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

bool v_array_contains<unsigned_int>(v_array<unsigned_int> *A,uint x)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = A->_begin;
  do {
    puVar2 = puVar1;
    if (puVar2 == A->_end) break;
    puVar1 = puVar2 + 1;
  } while (*puVar2 != x);
  return puVar2 != A->_end;
}

Assistant:

bool v_array_contains(v_array<T>& A, T x)
{
  for (T* e = A._begin; e != A._end; ++e)
    if (*e == x)
      return true;
  return false;
}